

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  this->FontData = (void *)0x0;
  this->FontDataSize = 0;
  this->FontDataOwnedByAtlas = true;
  this->FontNo = 0;
  this->SizePixels = 0.0;
  this->OversampleH = 3;
  this->OversampleV = 1;
  this->PixelSnapH = false;
  this->GlyphRanges = (ImWchar *)0x0;
  (this->GlyphExtraSpacing).x = 0.0;
  (this->GlyphExtraSpacing).y = 0.0;
  (this->GlyphOffset).x = 0.0;
  (this->GlyphOffset).y = 0.0;
  this->GlyphMinAdvanceX = 0.0;
  this->GlyphMaxAdvanceX = 3.4028235e+38;
  this->MergeMode = false;
  this->RasterizerFlags = 0;
  this->RasterizerMultiply = 1.0;
  this->Name[0] = '\0';
  this->Name[1] = '\0';
  this->Name[2] = '\0';
  this->Name[3] = '\0';
  this->Name[4] = '\0';
  this->Name[5] = '\0';
  this->Name[6] = '\0';
  this->Name[7] = '\0';
  this->Name[8] = '\0';
  this->Name[9] = '\0';
  this->Name[10] = '\0';
  this->Name[0xb] = '\0';
  this->Name[0xc] = '\0';
  this->Name[0xd] = '\0';
  this->Name[0xe] = '\0';
  this->Name[0xf] = '\0';
  this->Name[0x20] = '\0';
  this->Name[0x21] = '\0';
  this->Name[0x22] = '\0';
  this->Name[0x23] = '\0';
  this->Name[0x24] = '\0';
  this->Name[0x25] = '\0';
  this->Name[0x26] = '\0';
  this->Name[0x27] = '\0';
  this->Name[0x10] = '\0';
  this->Name[0x11] = '\0';
  this->Name[0x12] = '\0';
  this->Name[0x13] = '\0';
  this->Name[0x14] = '\0';
  this->Name[0x15] = '\0';
  this->Name[0x16] = '\0';
  this->Name[0x17] = '\0';
  this->Name[0x18] = '\0';
  this->Name[0x19] = '\0';
  this->Name[0x1a] = '\0';
  this->Name[0x1b] = '\0';
  this->Name[0x1c] = '\0';
  this->Name[0x1d] = '\0';
  this->Name[0x1e] = '\0';
  this->Name[0x1f] = '\0';
  this->DstFont = (ImFont *)0x0;
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    FontData = NULL;
    FontDataSize = 0;
    FontDataOwnedByAtlas = true;
    FontNo = 0;
    SizePixels = 0.0f;
    OversampleH = 3;
    OversampleV = 1;
    PixelSnapH = false;
    GlyphExtraSpacing = ImVec2(0.0f, 0.0f);
    GlyphOffset = ImVec2(0.0f, 0.0f);
    GlyphRanges = NULL;
    GlyphMinAdvanceX = 0.0f;
    GlyphMaxAdvanceX = FLT_MAX;
    MergeMode = false;
    RasterizerFlags = 0x00;
    RasterizerMultiply = 1.0f;
    memset(Name, 0, sizeof(Name));
    DstFont = NULL;
}